

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_2fdc60::ArgParser::initOptionTables(ArgParser *this)

{
  allocator<char> local_14c9;
  string local_14c8;
  anon_class_8_1_8991fb9c b;
  anon_class_8_1_8991fb9c p;
  bare_arg_handler_t local_1498;
  bare_arg_handler_t local_1478;
  bare_arg_handler_t local_1458;
  bare_arg_handler_t local_1438;
  bare_arg_handler_t local_1418;
  bare_arg_handler_t local_13f8;
  bare_arg_handler_t local_13d8;
  param_arg_handler_t local_13b8;
  param_arg_handler_t local_1398;
  param_arg_handler_t local_1378;
  bare_arg_handler_t local_1358;
  bare_arg_handler_t local_1338;
  bare_arg_handler_t local_1318;
  bare_arg_handler_t local_12f8;
  bare_arg_handler_t local_12d8;
  bare_arg_handler_t local_12b8;
  bare_arg_handler_t local_1298;
  bare_arg_handler_t local_1278;
  bare_arg_handler_t local_1258;
  bare_arg_handler_t local_1238;
  bare_arg_handler_t local_1218;
  param_arg_handler_t local_11f8;
  bare_arg_handler_t local_11d8;
  bare_arg_handler_t local_11b8;
  bare_arg_handler_t local_1198;
  bare_arg_handler_t local_1178;
  bare_arg_handler_t local_1158;
  _Any_data local_1138;
  code *local_1128;
  code *local_1120;
  _Any_data local_1110;
  code *local_1100;
  code *local_10f8;
  param_arg_handler_t local_10f0;
  _Any_data local_10d0;
  code *local_10c0;
  code *local_10b8;
  _Any_data local_10b0;
  code *local_10a0;
  code *local_1098;
  param_arg_handler_t local_1090;
  _Any_data local_1070;
  code *local_1060;
  code *local_1058;
  _Any_data local_1050;
  code *local_1040;
  code *local_1038;
  _Any_data local_1030;
  code *local_1020;
  code *local_1018;
  _Any_data local_1010;
  code *local_1000;
  code *local_ff8;
  _Any_data local_ff0;
  code *local_fe0;
  code *local_fd8;
  _Any_data local_fd0;
  code *local_fc0;
  code *local_fb8;
  _Any_data local_fb0;
  code *local_fa0;
  code *local_f98;
  param_arg_handler_t local_f90;
  _Any_data local_f70;
  code *local_f60;
  code *local_f58;
  _Any_data local_f50;
  code *local_f40;
  code *local_f38;
  _Any_data local_f30;
  code *local_f20;
  code *local_f18;
  _Any_data local_f10;
  code *local_f00;
  code *local_ef8;
  _Any_data local_ef0;
  code *local_ee0;
  code *local_ed8;
  param_arg_handler_t local_ed0;
  _Any_data local_eb0;
  code *local_ea0;
  code *local_e98;
  _Any_data local_e90;
  code *local_e80;
  code *local_e78;
  _Any_data local_e70;
  code *local_e60;
  code *local_e58;
  _Any_data local_e50;
  code *local_e40;
  code *local_e38;
  _Any_data local_e30;
  code *local_e20;
  code *local_e18;
  _Any_data local_e10;
  code *local_e00;
  code *local_df8;
  _Any_data local_df0;
  code *local_de0;
  code *local_dd8;
  _Any_data local_dd0;
  code *local_dc0;
  code *local_db8;
  _Any_data local_db0;
  code *local_da0;
  code *local_d98;
  _Any_data local_d90;
  code *local_d80;
  code *local_d78;
  _Any_data local_d70;
  code *local_d60;
  code *local_d58;
  _Any_data local_d50;
  code *local_d40;
  code *local_d38;
  _Any_data local_d30;
  code *local_d20;
  code *local_d18;
  _Any_data local_d10;
  code *local_d00;
  code *local_cf8;
  _Any_data local_cf0;
  code *local_ce0;
  code *local_cd8;
  _Any_data local_cd0;
  code *local_cc0;
  code *local_cb8;
  _Any_data local_cb0;
  code *local_ca0;
  code *local_c98;
  _Any_data local_c90;
  code *local_c80;
  code *local_c78;
  _Any_data local_c70;
  code *local_c60;
  code *local_c58;
  _Any_data local_c50;
  code *local_c40;
  code *local_c38;
  _Any_data local_c30;
  code *local_c20;
  code *local_c18;
  _Any_data local_c10;
  code *local_c00;
  code *local_bf8;
  _Any_data local_bf0;
  code *local_be0;
  code *local_bd8;
  _Any_data local_bd0;
  code *local_bc0;
  code *local_bb8;
  _Any_data local_bb0;
  code *local_ba0;
  code *local_b98;
  _Any_data local_b90;
  code *local_b80;
  code *local_b78;
  param_arg_handler_t local_b70;
  _Any_data local_b50;
  code *local_b40;
  code *local_b38;
  _Any_data local_b30;
  code *local_b20;
  code *local_b18;
  _Any_data local_b10;
  code *local_b00;
  code *local_af8;
  param_arg_handler_t local_af0;
  _Any_data local_ad0;
  code *local_ac0;
  code *local_ab8;
  _Any_data local_ab0;
  code *local_aa0;
  code *local_a98;
  _Any_data local_a90;
  code *local_a80;
  code *local_a78;
  _Any_data local_a70;
  code *local_a60;
  code *local_a58;
  _Any_data local_a50;
  code *local_a40;
  code *local_a38;
  _Any_data local_a30;
  code *local_a20;
  code *local_a18;
  _Any_data local_a10;
  code *local_a00;
  code *local_9f8;
  _Any_data local_9f0;
  code *local_9e0;
  code *local_9d8;
  _Any_data local_9d0;
  code *local_9c0;
  code *local_9b8;
  _Any_data local_9b0;
  code *local_9a0;
  code *local_998;
  _Any_data local_990;
  code *local_980;
  code *local_978;
  _Any_data local_970;
  code *local_960;
  code *local_958;
  _Any_data local_950;
  code *local_940;
  code *local_938;
  _Any_data local_930;
  code *local_920;
  code *local_918;
  _Any_data local_910;
  code *local_900;
  code *local_8f8;
  _Any_data local_8f0;
  code *local_8e0;
  code *local_8d8;
  _Any_data local_8d0;
  code *local_8c0;
  code *local_8b8;
  _Any_data local_8b0;
  code *local_8a0;
  code *local_898;
  _Any_data local_890;
  code *local_880;
  code *local_878;
  _Any_data local_870;
  code *local_860;
  code *local_858;
  _Any_data local_850;
  code *local_840;
  code *local_838;
  _Any_data local_830;
  code *local_820;
  code *local_818;
  _Any_data local_810;
  code *local_800;
  code *local_7f8;
  _Any_data local_7f0;
  code *local_7e0;
  code *local_7d8;
  _Any_data local_7d0;
  code *local_7c0;
  code *local_7b8;
  _Any_data local_7b0;
  code *local_7a0;
  code *local_798;
  _Any_data local_790;
  code *local_780;
  code *local_778;
  _Any_data local_770;
  code *local_760;
  code *local_758;
  _Any_data local_750;
  code *local_740;
  code *local_738;
  _Any_data local_730;
  code *local_720;
  code *local_718;
  _Any_data local_710;
  code *local_700;
  code *local_6f8;
  _Any_data local_6f0;
  code *local_6e0;
  code *local_6d8;
  _Any_data local_6d0;
  code *local_6c0;
  code *local_6b8;
  _Any_data local_6b0;
  code *local_6a0;
  code *local_698;
  _Any_data local_690;
  code *local_680;
  code *local_678;
  _Any_data local_670;
  code *local_660;
  code *local_658;
  _Any_data local_650;
  code *local_640;
  code *local_638;
  _Any_data local_630;
  code *local_620;
  code *local_618;
  _Any_data local_610;
  code *local_600;
  code *local_5f8;
  _Any_data local_5f0;
  code *local_5e0;
  code *local_5d8;
  _Any_data local_5d0;
  code *local_5c0;
  code *local_5b8;
  _Any_data local_5b0;
  code *local_5a0;
  code *local_598;
  _Any_data local_590;
  code *local_580;
  code *local_578;
  _Any_data local_570;
  code *local_560;
  code *local_558;
  _Any_data local_550;
  code *local_540;
  code *local_538;
  _Any_data local_530;
  code *local_520;
  code *local_518;
  _Any_data local_510;
  code *local_500;
  code *local_4f8;
  _Any_data local_4f0;
  code *local_4e0;
  code *local_4d8;
  _Any_data local_4d0;
  code *local_4c0;
  code *local_4b8;
  _Any_data local_4b0;
  code *local_4a0;
  code *local_498;
  _Any_data local_490;
  code *local_480;
  code *local_478;
  _Any_data local_470;
  code *local_460;
  code *local_458;
  _Any_data local_450;
  code *local_440;
  code *local_438;
  _Any_data local_430;
  code *local_420;
  code *local_418;
  _Any_data local_410;
  code *local_400;
  code *local_3f8;
  _Any_data local_3f0;
  code *local_3e0;
  code *local_3d8;
  _Any_data local_3d0;
  code *local_3c0;
  code *local_3b8;
  _Any_data local_3b0;
  code *local_3a0;
  code *local_398;
  _Any_data local_390;
  code *local_380;
  code *local_378;
  _Any_data local_370;
  code *local_360;
  code *local_358;
  _Any_data local_350;
  code *local_340;
  code *local_338;
  _Any_data local_330;
  code *local_320;
  code *local_318;
  _Any_data local_310;
  code *local_300;
  code *local_2f8;
  _Any_data local_2f0;
  code *local_2e0;
  code *local_2d8;
  _Any_data local_2d0;
  code *local_2c0;
  code *local_2b8;
  _Any_data local_2b0;
  code *local_2a0;
  code *local_298;
  _Any_data local_290;
  code *local_280;
  code *local_278;
  _Any_data local_270;
  code *local_260;
  code *local_258;
  _Any_data local_250;
  code *local_240;
  code *local_238;
  _Any_data local_230;
  code *local_220;
  code *local_218;
  _Any_data local_210;
  code *local_200;
  code *local_1f8;
  _Any_data local_1f0;
  code *local_1e0;
  code *local_1d8;
  _Any_data local_1d0;
  code *local_1c0;
  code *local_1b8;
  _Any_data local_1b0;
  code *local_1a0;
  code *local_198;
  _Any_data local_190;
  code *local_180;
  code *local_178;
  _Any_data local_170;
  code *local_160;
  code *local_158;
  _Any_data local_150;
  code *local_140;
  code *local_138;
  _Any_data local_130;
  code *local_120;
  code *local_118;
  _Any_data local_110;
  code *local_100;
  code *local_f8;
  _Any_data local_f0;
  code *local_e0;
  code *local_d8;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  param_arg_handler_t local_30;
  
  b.this = this;
  p.this = this;
  QPDFArgParser::selectHelpOptionTable(&this->ap);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"version",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_1158,&b,0x1f65f0);
  QPDFArgParser::addBare(&this->ap,&local_14c8,&local_1158);
  std::_Function_base::~_Function_base(&local_1158.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"copyright",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_1178,&b,0x1f66dc);
  QPDFArgParser::addBare(&this->ap,&local_14c8,&local_1178);
  std::_Function_base::~_Function_base(&local_1178.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"show-crypto",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_1198,&b,0x1f68d8);
  QPDFArgParser::addBare(&this->ap,&local_14c8,&local_1198);
  std::_Function_base::~_Function_base(&local_1198.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"job-json-help",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_11b8,&b,0x1f6a36);
  QPDFArgParser::addBare(&this->ap,&local_14c8,&local_11b8);
  std::_Function_base::~_Function_base(&local_11b8.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"zopfli",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_11d8,&b,0x1f6ada);
  QPDFArgParser::addBare(&this->ap,&local_14c8,&local_11d8);
  std::_Function_base::~_Function_base(&local_11d8.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"json-help",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_11f8,&p,0x1f6c06);
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,&local_11f8,false,initOptionTables::json_version_choices);
  std::_Function_base::~_Function_base(&local_11f8.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  QPDFArgParser::selectMainOptionTable(&this->ap);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_30,&p,0x1f6d50);
  QPDFArgParser::addPositional(&this->ap,&local_30);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"add-attachment",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_1218,&b,0x1f6de0);
  QPDFArgParser::addBare(&this->ap,&local_14c8,&local_1218);
  std::_Function_base::~_Function_base(&local_1218.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"allow-weak-crypto",&local_14c9);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:40:39)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:40:39)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_50);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"check",&local_14c9);
  local_70._8_8_ = 0;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:41:27)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:41:27)>
             ::_M_manager;
  local_70._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"check-linearization",&local_14c9);
  local_90._8_8_ = 0;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:42:41)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:42:41)>
             ::_M_manager;
  local_90._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_90);
  std::_Function_base::~_Function_base((_Function_base *)&local_90);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"coalesce-contents",&local_14c9);
  local_b0._8_8_ = 0;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:43:39)>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:43:39)>
             ::_M_manager;
  local_b0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_b0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"copy-attachments-from",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_1238,&b,0x1f6e5c);
  QPDFArgParser::addBare(&this->ap,&local_14c8,&local_1238);
  std::_Function_base::~_Function_base(&local_1238.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"decrypt",&local_14c9);
  local_d0._8_8_ = 0;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:45:29)>
             ::_M_invoke;
  local_c0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:45:29)>
             ::_M_manager;
  local_d0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_d0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"deterministic-id",&local_14c9);
  local_f0._8_8_ = 0;
  local_d8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:46:38)>
             ::_M_invoke;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:46:38)>
             ::_M_manager;
  local_f0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_f0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"empty",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_1258,&b,0x1f6ed8);
  QPDFArgParser::addBare(&this->ap,&local_14c8,&local_1258);
  std::_Function_base::~_Function_base(&local_1258.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"encrypt",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_1278,&b,0x1f6eee);
  QPDFArgParser::addBare(&this->ap,&local_14c8,&local_1278);
  std::_Function_base::~_Function_base(&local_1278.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"externalize-inline-images",&local_14c9);
  local_110._8_8_ = 0;
  local_f8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:49:47)>
             ::_M_invoke;
  local_100 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:49:47)>
              ::_M_manager;
  local_110._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_110);
  std::_Function_base::~_Function_base((_Function_base *)&local_110);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"filtered-stream-data",&local_14c9);
  local_130._8_8_ = 0;
  local_118 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:50:42)>
              ::_M_invoke;
  local_120 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:50:42)>
              ::_M_manager;
  local_130._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_130);
  std::_Function_base::~_Function_base((_Function_base *)&local_130);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"flatten-rotation",&local_14c9);
  local_150._8_8_ = 0;
  local_138 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:51:38)>
              ::_M_invoke;
  local_140 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:51:38)>
              ::_M_manager;
  local_150._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_150);
  std::_Function_base::~_Function_base((_Function_base *)&local_150);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"generate-appearances",&local_14c9);
  local_170._8_8_ = 0;
  local_158 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:52:42)>
              ::_M_invoke;
  local_160 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:52:42)>
              ::_M_manager;
  local_170._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_170);
  std::_Function_base::~_Function_base((_Function_base *)&local_170);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"ignore-xref-streams",&local_14c9);
  local_190._8_8_ = 0;
  local_178 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:53:41)>
              ::_M_invoke;
  local_180 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:53:41)>
              ::_M_manager;
  local_190._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_190);
  std::_Function_base::~_Function_base((_Function_base *)&local_190);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"is-encrypted",&local_14c9);
  local_1b0._8_8_ = 0;
  local_198 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:54:34)>
              ::_M_invoke;
  local_1a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:54:34)>
              ::_M_manager;
  local_1b0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_1b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"json-input",&local_14c9)
  ;
  local_1d0._8_8_ = 0;
  local_1b8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:55:32)>
              ::_M_invoke;
  local_1c0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:55:32)>
              ::_M_manager;
  local_1d0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_1d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"keep-inline-images",&local_14c9);
  local_1f0._8_8_ = 0;
  local_1d8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:56:40)>
              ::_M_invoke;
  local_1e0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:56:40)>
              ::_M_manager;
  local_1f0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_1f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"linearize",&local_14c9);
  local_210._8_8_ = 0;
  local_1f8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:57:31)>
              ::_M_invoke;
  local_200 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:57:31)>
              ::_M_manager;
  local_210._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_210);
  std::_Function_base::~_Function_base((_Function_base *)&local_210);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"list-attachments",&local_14c9);
  local_230._8_8_ = 0;
  local_218 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:58:38)>
              ::_M_invoke;
  local_220 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:58:38)>
              ::_M_manager;
  local_230._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_230);
  std::_Function_base::~_Function_base((_Function_base *)&local_230);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"newline-before-endstream",&local_14c9);
  local_250._8_8_ = 0;
  local_238 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:59:46)>
              ::_M_invoke;
  local_240 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:59:46)>
              ::_M_manager;
  local_250._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_250);
  std::_Function_base::~_Function_base((_Function_base *)&local_250);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"no-original-object-ids",&local_14c9);
  local_270._8_8_ = 0;
  local_258 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:60:44)>
              ::_M_invoke;
  local_260 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:60:44)>
              ::_M_manager;
  local_270._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_270);
  std::_Function_base::~_Function_base((_Function_base *)&local_270);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"no-warn",&local_14c9);
  local_290._8_8_ = 0;
  local_278 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:61:29)>
              ::_M_invoke;
  local_280 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:61:29)>
              ::_M_manager;
  local_290._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_290);
  std::_Function_base::~_Function_base((_Function_base *)&local_290);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"optimize-images",&local_14c9);
  local_2b0._8_8_ = 0;
  local_298 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:62:37)>
              ::_M_invoke;
  local_2a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:62:37)>
              ::_M_manager;
  local_2b0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_2b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"overlay",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_1298,&b,0x1f6fd8);
  QPDFArgParser::addBare(&this->ap,&local_14c8,&local_1298);
  std::_Function_base::~_Function_base(&local_1298.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"pages",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_12b8,&b,0x1f7054);
  QPDFArgParser::addBare(&this->ap,&local_14c8,&local_12b8);
  std::_Function_base::~_Function_base(&local_12b8.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"password-is-hex-key",&local_14c9);
  local_2d0._8_8_ = 0;
  local_2b8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:65:41)>
              ::_M_invoke;
  local_2c0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:65:41)>
              ::_M_manager;
  local_2d0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_2d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"preserve-unreferenced",&local_14c9);
  local_2f0._8_8_ = 0;
  local_2d8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:66:43)>
              ::_M_invoke;
  local_2e0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:66:43)>
              ::_M_manager;
  local_2f0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_2f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"preserve-unreferenced-resources",&local_14c9);
  local_310._8_8_ = 0;
  local_2f8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:67:53)>
              ::_M_invoke;
  local_300 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:67:53)>
              ::_M_manager;
  local_310._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_310);
  std::_Function_base::~_Function_base((_Function_base *)&local_310);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"progress",&local_14c9);
  local_330._8_8_ = 0;
  local_318 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:68:30)>
              ::_M_invoke;
  local_320 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:68:30)>
              ::_M_manager;
  local_330._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_330);
  std::_Function_base::~_Function_base((_Function_base *)&local_330);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"qdf",&local_14c9);
  local_350._8_8_ = 0;
  local_338 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:69:25)>
              ::_M_invoke;
  local_340 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:69:25)>
              ::_M_manager;
  local_350._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_350);
  std::_Function_base::~_Function_base((_Function_base *)&local_350);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"raw-stream-data",&local_14c9);
  local_370._8_8_ = 0;
  local_358 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:70:37)>
              ::_M_invoke;
  local_360 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:70:37)>
              ::_M_manager;
  local_370._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_370);
  std::_Function_base::~_Function_base((_Function_base *)&local_370);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"recompress-flate",&local_14c9);
  local_390._8_8_ = 0;
  local_378 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:71:38)>
              ::_M_invoke;
  local_380 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:71:38)>
              ::_M_manager;
  local_390._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_390);
  std::_Function_base::~_Function_base((_Function_base *)&local_390);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"remove-info",&local_14c9);
  local_3b0._8_8_ = 0;
  local_398 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:72:33)>
              ::_M_invoke;
  local_3a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:72:33)>
              ::_M_manager;
  local_3b0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_3b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"remove-metadata",&local_14c9);
  local_3d0._8_8_ = 0;
  local_3b8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:73:37)>
              ::_M_invoke;
  local_3c0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:73:37)>
              ::_M_manager;
  local_3d0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_3d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"remove-page-labels",&local_14c9);
  local_3f0._8_8_ = 0;
  local_3d8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:74:40)>
              ::_M_invoke;
  local_3e0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:74:40)>
              ::_M_manager;
  local_3f0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_3f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"remove-structure",&local_14c9);
  local_410._8_8_ = 0;
  local_3f8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:75:38)>
              ::_M_invoke;
  local_400 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:75:38)>
              ::_M_manager;
  local_410._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_410);
  std::_Function_base::~_Function_base((_Function_base *)&local_410);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"replace-input",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_12d8,&b,0x1f70da);
  QPDFArgParser::addBare(&this->ap,&local_14c8,&local_12d8);
  std::_Function_base::~_Function_base(&local_12d8.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"report-memory-usage",&local_14c9);
  local_430._8_8_ = 0;
  local_418 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:77:41)>
              ::_M_invoke;
  local_420 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:77:41)>
              ::_M_manager;
  local_430._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_430);
  std::_Function_base::~_Function_base((_Function_base *)&local_430);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"requires-password",&local_14c9);
  local_450._8_8_ = 0;
  local_438 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:78:39)>
              ::_M_invoke;
  local_440 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:78:39)>
              ::_M_manager;
  local_450._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_450);
  std::_Function_base::~_Function_base((_Function_base *)&local_450);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"remove-restrictions",&local_14c9);
  local_470._8_8_ = 0;
  local_458 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:79:41)>
              ::_M_invoke;
  local_460 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:79:41)>
              ::_M_manager;
  local_470._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_470);
  std::_Function_base::~_Function_base((_Function_base *)&local_470);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"set-page-labels",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_12f8,&b,0x1f70f0);
  QPDFArgParser::addBare(&this->ap,&local_14c8,&local_12f8);
  std::_Function_base::~_Function_base(&local_12f8.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"show-encryption",&local_14c9);
  local_490._8_8_ = 0;
  local_478 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:81:37)>
              ::_M_invoke;
  local_480 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:81:37)>
              ::_M_manager;
  local_490._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_490);
  std::_Function_base::~_Function_base((_Function_base *)&local_490);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"show-encryption-key",&local_14c9);
  local_4b0._8_8_ = 0;
  local_498 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:82:41)>
              ::_M_invoke;
  local_4a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:82:41)>
              ::_M_manager;
  local_4b0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_4b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"show-linearization",&local_14c9);
  local_4d0._8_8_ = 0;
  local_4b8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:83:40)>
              ::_M_invoke;
  local_4c0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:83:40)>
              ::_M_manager;
  local_4d0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_4d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"show-npages",&local_14c9);
  local_4f0._8_8_ = 0;
  local_4d8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:84:33)>
              ::_M_invoke;
  local_4e0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:84:33)>
              ::_M_manager;
  local_4f0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_4f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"show-pages",&local_14c9)
  ;
  local_510._8_8_ = 0;
  local_4f8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:85:32)>
              ::_M_invoke;
  local_500 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:85:32)>
              ::_M_manager;
  local_510._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_510);
  std::_Function_base::~_Function_base((_Function_base *)&local_510);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"show-xref",&local_14c9);
  local_530._8_8_ = 0;
  local_518 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:86:31)>
              ::_M_invoke;
  local_520 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:86:31)>
              ::_M_manager;
  local_530._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_530);
  std::_Function_base::~_Function_base((_Function_base *)&local_530);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"static-aes-iv",&local_14c9);
  local_550._8_8_ = 0;
  local_538 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:87:35)>
              ::_M_invoke;
  local_540 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:87:35)>
              ::_M_manager;
  local_550._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_550);
  std::_Function_base::~_Function_base((_Function_base *)&local_550);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"static-id",&local_14c9);
  local_570._8_8_ = 0;
  local_558 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:88:31)>
              ::_M_invoke;
  local_560 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:88:31)>
              ::_M_manager;
  local_570._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_570);
  std::_Function_base::~_Function_base((_Function_base *)&local_570);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"suppress-password-recovery",&local_14c9);
  local_590._8_8_ = 0;
  local_578 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:89:48)>
              ::_M_invoke;
  local_580 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:89:48)>
              ::_M_manager;
  local_590._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_590);
  std::_Function_base::~_Function_base((_Function_base *)&local_590);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"suppress-recovery",&local_14c9);
  local_5b0._8_8_ = 0;
  local_598 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:90:39)>
              ::_M_invoke;
  local_5a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:90:39)>
              ::_M_manager;
  local_5b0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_5b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"test-json-schema",&local_14c9);
  local_5d0._8_8_ = 0;
  local_5b8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:91:38)>
              ::_M_invoke;
  local_5c0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:91:38)>
              ::_M_manager;
  local_5d0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_5d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"underlay",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_1318,&b,0x1f7152);
  QPDFArgParser::addBare(&this->ap,&local_14c8,&local_1318);
  std::_Function_base::~_Function_base(&local_1318.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"verbose",&local_14c9);
  local_5f0._8_8_ = 0;
  local_5d8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:93:29)>
              ::_M_invoke;
  local_5e0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:93:29)>
              ::_M_manager;
  local_5f0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_5f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"warning-exit-0",&local_14c9);
  local_610._8_8_ = 0;
  local_5f8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:94:36)>
              ::_M_invoke;
  local_600 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:94:36)>
              ::_M_manager;
  local_610._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_610);
  std::_Function_base::~_Function_base((_Function_base *)&local_610);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"with-images",&local_14c9);
  local_630._8_8_ = 0;
  local_618 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:95:33)>
              ::_M_invoke;
  local_620 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:95:33)>
              ::_M_manager;
  local_630._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_630);
  std::_Function_base::~_Function_base((_Function_base *)&local_630);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"compression-level",&local_14c9);
  local_650._8_8_ = 0;
  local_638 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:96:52)>
              ::_M_invoke;
  local_640 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:96:52)>
              ::_M_manager;
  local_650._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_650,"level");
  std::_Function_base::~_Function_base((_Function_base *)&local_650);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"jpeg-quality",&local_14c9);
  local_670._8_8_ = 0;
  local_658 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:97:47)>
              ::_M_invoke;
  local_660 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:97:47)>
              ::_M_manager;
  local_670._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_670,"level");
  std::_Function_base::~_Function_base((_Function_base *)&local_670);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"copy-encryption",&local_14c9);
  local_690._8_8_ = 0;
  local_678 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:98:50)>
              ::_M_invoke;
  local_680 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:98:50)>
              ::_M_manager;
  local_690._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_690,"file");
  std::_Function_base::~_Function_base((_Function_base *)&local_690);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"encryption-file-password",&local_14c9);
  local_6b0._8_8_ = 0;
  local_698 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:99:59)>
              ::_M_invoke;
  local_6a0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:99:59)>
              ::_M_manager;
  local_6b0._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_6b0,"password");
  std::_Function_base::~_Function_base((_Function_base *)&local_6b0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"force-version",&local_14c9);
  local_6d0._8_8_ = 0;
  local_6b8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:100:48)>
              ::_M_invoke;
  local_6c0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:100:48)>
              ::_M_manager;
  local_6d0._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_6d0,"version");
  std::_Function_base::~_Function_base((_Function_base *)&local_6d0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"ii-min-bytes",&local_14c9);
  local_6f0._8_8_ = 0;
  local_6d8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:101:47)>
              ::_M_invoke;
  local_6e0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:101:47)>
              ::_M_manager;
  local_6f0._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_6f0,"minimum");
  std::_Function_base::~_Function_base((_Function_base *)&local_6f0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"job-json-file",&local_14c9);
  local_710._8_8_ = 0;
  local_6f8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:102:48)>
              ::_M_invoke;
  local_700 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:102:48)>
              ::_M_manager;
  local_710._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_710,"file");
  std::_Function_base::~_Function_base((_Function_base *)&local_710);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"json-object",&local_14c9);
  local_730._8_8_ = 0;
  local_718 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:103:46)>
              ::_M_invoke;
  local_720 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:103:46)>
              ::_M_manager;
  local_730._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_730,"trailer");
  std::_Function_base::~_Function_base((_Function_base *)&local_730);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"keep-files-open-threshold",&local_14c9);
  local_750._8_8_ = 0;
  local_738 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:104:60)>
              ::_M_invoke;
  local_740 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:104:60)>
              ::_M_manager;
  local_750._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_750,"count");
  std::_Function_base::~_Function_base((_Function_base *)&local_750);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"linearize-pass1",&local_14c9);
  local_770._8_8_ = 0;
  local_758 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:105:50)>
              ::_M_invoke;
  local_760 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:105:50)>
              ::_M_manager;
  local_770._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_770,"filename");
  std::_Function_base::~_Function_base((_Function_base *)&local_770);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"min-version",&local_14c9);
  local_790._8_8_ = 0;
  local_778 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:106:46)>
              ::_M_invoke;
  local_780 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:106:46)>
              ::_M_manager;
  local_790._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_790,"version");
  std::_Function_base::~_Function_base((_Function_base *)&local_790);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"oi-min-area",&local_14c9);
  local_7b0._8_8_ = 0;
  local_798 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:107:46)>
              ::_M_invoke;
  local_7a0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:107:46)>
              ::_M_manager;
  local_7b0._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_7b0,"minimum");
  std::_Function_base::~_Function_base((_Function_base *)&local_7b0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"oi-min-height",&local_14c9);
  local_7d0._8_8_ = 0;
  local_7b8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:108:48)>
              ::_M_invoke;
  local_7c0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:108:48)>
              ::_M_manager;
  local_7d0._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_7d0,"minimum");
  std::_Function_base::~_Function_base((_Function_base *)&local_7d0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"oi-min-width",&local_14c9);
  local_7f0._8_8_ = 0;
  local_7d8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:109:47)>
              ::_M_invoke;
  local_7e0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:109:47)>
              ::_M_manager;
  local_7f0._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_7f0,"minimum");
  std::_Function_base::~_Function_base((_Function_base *)&local_7f0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"password",&local_14c9);
  local_810._8_8_ = 0;
  local_7f8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:110:43)>
              ::_M_invoke;
  local_800 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:110:43)>
              ::_M_manager;
  local_810._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_810,"password");
  std::_Function_base::~_Function_base((_Function_base *)&local_810);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"password-file",&local_14c9);
  local_830._8_8_ = 0;
  local_818 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:111:48)>
              ::_M_invoke;
  local_820 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:111:48)>
              ::_M_manager;
  local_830._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_830,"password");
  std::_Function_base::~_Function_base((_Function_base *)&local_830);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"remove-attachment",&local_14c9);
  local_850._8_8_ = 0;
  local_838 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:112:52)>
              ::_M_invoke;
  local_840 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:112:52)>
              ::_M_manager;
  local_850._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_850,"attachment");
  std::_Function_base::~_Function_base((_Function_base *)&local_850);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"rotate",&local_14c9);
  local_870._8_8_ = 0;
  local_858 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:113:41)>
              ::_M_invoke;
  local_860 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:113:41)>
              ::_M_manager;
  local_870._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_870,"[+|-]angle");
  std::_Function_base::~_Function_base((_Function_base *)&local_870);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"show-attachment",&local_14c9);
  local_890._8_8_ = 0;
  local_878 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:114:50)>
              ::_M_invoke;
  local_880 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:114:50)>
              ::_M_manager;
  local_890._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_890,"attachment");
  std::_Function_base::~_Function_base((_Function_base *)&local_890);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"show-object",&local_14c9);
  local_8b0._8_8_ = 0;
  local_898 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:115:46)>
              ::_M_invoke;
  local_8a0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:115:46)>
              ::_M_manager;
  local_8b0._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_8b0,"trailer");
  std::_Function_base::~_Function_base((_Function_base *)&local_8b0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"json-stream-prefix",&local_14c9);
  local_8d0._8_8_ = 0;
  local_8b8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:116:53)>
              ::_M_invoke;
  local_8c0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:116:53)>
              ::_M_manager;
  local_8d0._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_8d0,"stream-file-prefix");
  std::_Function_base::~_Function_base((_Function_base *)&local_8d0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"update-from-json",&local_14c9);
  local_8f0._8_8_ = 0;
  local_8d8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:117:51)>
              ::_M_invoke;
  local_8e0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:117:51)>
              ::_M_manager;
  local_8f0._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_8f0,"qpdf-json file");
  std::_Function_base::~_Function_base((_Function_base *)&local_8f0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"collate",&local_14c9);
  local_910._8_8_ = 0;
  local_8f8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:118:42)>
              ::_M_invoke;
  local_900 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:118:42)>
              ::_M_manager;
  local_910._M_unused._M_object = this;
  QPDFArgParser::addOptionalParameter(&this->ap,&local_14c8,(param_arg_handler_t *)&local_910);
  std::_Function_base::~_Function_base((_Function_base *)&local_910);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"split-pages",&local_14c9);
  local_930._8_8_ = 0;
  local_918 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:119:46)>
              ::_M_invoke;
  local_920 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:119:46)>
              ::_M_manager;
  local_930._M_unused._M_object = this;
  QPDFArgParser::addOptionalParameter(&this->ap,&local_14c8,(param_arg_handler_t *)&local_930);
  std::_Function_base::~_Function_base((_Function_base *)&local_930);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"compress-streams",&local_14c9);
  local_950._8_8_ = 0;
  local_938 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:120:41)>
              ::_M_invoke;
  local_940 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:120:41)>
              ::_M_manager;
  local_950._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_950,true,
             initOptionTables::yn_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_950);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"decode-level",&local_14c9);
  local_970._8_8_ = 0;
  local_958 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:121:37)>
              ::_M_invoke;
  local_960 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:121:37)>
              ::_M_manager;
  local_970._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_970,true,
             initOptionTables::decode_level_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_970);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"flatten-annotations",&local_14c9);
  local_990._8_8_ = 0;
  local_978 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:122:44)>
              ::_M_invoke;
  local_980 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:122:44)>
              ::_M_manager;
  local_990._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_990,true,
             initOptionTables::flatten_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_990);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"json-key",&local_14c9);
  local_9b0._8_8_ = 0;
  local_998 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:123:33)>
              ::_M_invoke;
  local_9a0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:123:33)>
              ::_M_manager;
  local_9b0._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_9b0,true,
             initOptionTables::json_key_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_9b0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"json-stream-data",&local_14c9);
  local_9d0._8_8_ = 0;
  local_9b8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:124:41)>
              ::_M_invoke;
  local_9c0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:124:41)>
              ::_M_manager;
  local_9d0._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_9d0,true,
             initOptionTables::json_stream_data_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_9d0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"keep-files-open",&local_14c9);
  local_9f0._8_8_ = 0;
  local_9d8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:125:40)>
              ::_M_invoke;
  local_9e0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:125:40)>
              ::_M_manager;
  local_9f0._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_9f0,true,
             initOptionTables::yn_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_9f0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"normalize-content",&local_14c9);
  local_a10._8_8_ = 0;
  local_9f8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:126:42)>
              ::_M_invoke;
  local_a00 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:126:42)>
              ::_M_manager;
  local_a10._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_a10,true,
             initOptionTables::yn_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_a10);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"object-streams",&local_14c9);
  local_a30._8_8_ = 0;
  local_a18 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:127:39)>
              ::_M_invoke;
  local_a20 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:127:39)>
              ::_M_manager;
  local_a30._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_a30,true,
             initOptionTables::object_streams_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_a30);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"password-mode",&local_14c9);
  local_a50._8_8_ = 0;
  local_a38 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:128:38)>
              ::_M_invoke;
  local_a40 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:128:38)>
              ::_M_manager;
  local_a50._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_a50,true,
             initOptionTables::password_mode_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_a50);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"remove-unreferenced-resources",&local_14c9);
  local_a70._8_8_ = 0;
  local_a58 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:129:54)>
              ::_M_invoke;
  local_a60 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:129:54)>
              ::_M_manager;
  local_a70._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_a70,true,
             initOptionTables::remove_unref_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_a70);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"stream-data",&local_14c9);
  local_a90._8_8_ = 0;
  local_a78 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:130:36)>
              ::_M_invoke;
  local_a80 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:130:36)>
              ::_M_manager;
  local_a90._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_a90,true,
             initOptionTables::stream_data_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_a90);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"json",&local_14c9);
  local_ab0._8_8_ = 0;
  local_a98 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:131:29)>
              ::_M_invoke;
  local_aa0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:131:29)>
              ::_M_manager;
  local_ab0._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_ab0,false,
             initOptionTables::json_version_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_ab0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"json-output",&local_14c9);
  local_ad0._8_8_ = 0;
  local_ab8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:132:36)>
              ::_M_invoke;
  local_ac0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:132:36)>
              ::_M_manager;
  local_ad0._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_ad0,false,
             initOptionTables::json_output_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_ad0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"pages",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_1338,&b,0x1f71ce);
  QPDFArgParser::registerOptionTable(&this->ap,&local_14c8,&local_1338);
  std::_Function_base::~_Function_base(&local_1338.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_af0,&p,0x1f7204);
  QPDFArgParser::addPositional(&this->ap,&local_af0);
  std::_Function_base::~_Function_base(&local_af0.super__Function_base);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"file",&local_14c9);
  local_b10._8_8_ = 0;
  local_af8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:135:39)>
              ::_M_invoke;
  local_b00 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:135:39)>
              ::_M_manager;
  local_b10._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_b10,"file");
  std::_Function_base::~_Function_base((_Function_base *)&local_b10);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"range",&local_14c9);
  local_b30._8_8_ = 0;
  local_b18 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:136:40)>
              ::_M_invoke;
  local_b20 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:136:40)>
              ::_M_manager;
  local_b30._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_b30,"page-range");
  std::_Function_base::~_Function_base((_Function_base *)&local_b30);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"password",&local_14c9);
  local_b50._8_8_ = 0;
  local_b38 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:137:43)>
              ::_M_invoke;
  local_b40 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:137:43)>
              ::_M_manager;
  local_b50._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_b50,"password");
  std::_Function_base::~_Function_base((_Function_base *)&local_b50);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"encryption",&local_14c9)
  ;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_1358,&b,0x1f7334);
  QPDFArgParser::registerOptionTable(&this->ap,&local_14c8,&local_1358);
  std::_Function_base::~_Function_base(&local_1358.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_b70,&p,0x1f736a);
  QPDFArgParser::addPositional(&this->ap,&local_b70);
  std::_Function_base::~_Function_base(&local_b70.super__Function_base);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"user-password",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_1378,&p,0x1f745e);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_14c8,&local_1378,"user_password");
  std::_Function_base::~_Function_base(&local_1378.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"owner-password",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_1398,&p,0x1f74de);
  QPDFArgParser::addRequiredParameter(&this->ap,&local_14c8,&local_1398,"owner_password");
  std::_Function_base::~_Function_base(&local_1398.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"bits",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_13b8,&p,0x1f755e);
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,&local_13b8,true,initOptionTables::enc_bits_choices);
  std::_Function_base::~_Function_base(&local_13b8.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"40-bit encryption",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_13d8,&b,0x1f7712);
  QPDFArgParser::registerOptionTable(&this->ap,&local_14c8,&local_13d8);
  std::_Function_base::~_Function_base(&local_13d8.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"extract",&local_14c9);
  local_b90._8_8_ = 0;
  local_b78 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:144:32)>
              ::_M_invoke;
  local_b80 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:144:32)>
              ::_M_manager;
  local_b90._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_b90,true,
             initOptionTables::yn_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_b90);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"annotate",&local_14c9);
  local_bb0._8_8_ = 0;
  local_b98 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:145:33)>
              ::_M_invoke;
  local_ba0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:145:33)>
              ::_M_manager;
  local_bb0._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_bb0,true,
             initOptionTables::yn_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_bb0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"print",&local_14c9);
  local_bd0._8_8_ = 0;
  local_bb8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:146:30)>
              ::_M_invoke;
  local_bc0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:146:30)>
              ::_M_manager;
  local_bd0._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_bd0,true,
             initOptionTables::yn_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_bd0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"modify",&local_14c9);
  local_bf0._8_8_ = 0;
  local_bd8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:147:31)>
              ::_M_invoke;
  local_be0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:147:31)>
              ::_M_manager;
  local_bf0._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_bf0,true,
             initOptionTables::yn_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_bf0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"128-bit encryption",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_13f8,&b,0x1f7718);
  QPDFArgParser::registerOptionTable(&this->ap,&local_14c8,&local_13f8);
  std::_Function_base::~_Function_base(&local_13f8.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"cleartext-metadata",&local_14c9);
  local_c10._8_8_ = 0;
  local_bf8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:149:40)>
              ::_M_invoke;
  local_c00 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:149:40)>
              ::_M_manager;
  local_c10._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_c10);
  std::_Function_base::~_Function_base((_Function_base *)&local_c10);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"force-V4",&local_14c9);
  local_c30._8_8_ = 0;
  local_c18 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:150:30)>
              ::_M_invoke;
  local_c20 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:150:30)>
              ::_M_manager;
  local_c30._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_c30);
  std::_Function_base::~_Function_base((_Function_base *)&local_c30);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"accessibility",&local_14c9);
  local_c50._8_8_ = 0;
  local_c38 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:151:38)>
              ::_M_invoke;
  local_c40 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:151:38)>
              ::_M_manager;
  local_c50._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_c50,true,
             initOptionTables::yn_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_c50);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"extract",&local_14c9);
  local_c70._8_8_ = 0;
  local_c58 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:152:32)>
              ::_M_invoke;
  local_c60 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:152:32)>
              ::_M_manager;
  local_c70._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_c70,true,
             initOptionTables::yn_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_c70);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"print",&local_14c9);
  local_c90._8_8_ = 0;
  local_c78 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:153:30)>
              ::_M_invoke;
  local_c80 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:153:30)>
              ::_M_manager;
  local_c90._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_c90,true,
             initOptionTables::print128_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_c90);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"assemble",&local_14c9);
  local_cb0._8_8_ = 0;
  local_c98 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:154:33)>
              ::_M_invoke;
  local_ca0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:154:33)>
              ::_M_manager;
  local_cb0._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_cb0,true,
             initOptionTables::yn_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_cb0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"annotate",&local_14c9);
  local_cd0._8_8_ = 0;
  local_cb8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:155:33)>
              ::_M_invoke;
  local_cc0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:155:33)>
              ::_M_manager;
  local_cd0._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_cd0,true,
             initOptionTables::yn_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_cd0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"form",&local_14c9);
  local_cf0._8_8_ = 0;
  local_cd8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:156:29)>
              ::_M_invoke;
  local_ce0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:156:29)>
              ::_M_manager;
  local_cf0._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_cf0,true,
             initOptionTables::yn_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_cf0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"modify-other",&local_14c9);
  local_d10._8_8_ = 0;
  local_cf8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:157:37)>
              ::_M_invoke;
  local_d00 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:157:37)>
              ::_M_manager;
  local_d10._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_d10,true,
             initOptionTables::yn_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_d10);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"modify",&local_14c9);
  local_d30._8_8_ = 0;
  local_d18 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:158:31)>
              ::_M_invoke;
  local_d20 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:158:31)>
              ::_M_manager;
  local_d30._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_d30,true,
             initOptionTables::modify128_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_d30);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"use-aes",&local_14c9);
  local_d50._8_8_ = 0;
  local_d38 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:159:32)>
              ::_M_invoke;
  local_d40 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:159:32)>
              ::_M_manager;
  local_d50._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_d50,true,
             initOptionTables::yn_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_d50);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"256-bit encryption",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_1418,&b,0x1f771e);
  QPDFArgParser::registerOptionTable(&this->ap,&local_14c8,&local_1418);
  std::_Function_base::~_Function_base(&local_1418.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"cleartext-metadata",&local_14c9);
  local_d70._8_8_ = 0;
  local_d58 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:161:40)>
              ::_M_invoke;
  local_d60 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:161:40)>
              ::_M_manager;
  local_d70._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_d70);
  std::_Function_base::~_Function_base((_Function_base *)&local_d70);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"force-R5",&local_14c9);
  local_d90._8_8_ = 0;
  local_d78 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:162:30)>
              ::_M_invoke;
  local_d80 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:162:30)>
              ::_M_manager;
  local_d90._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_d90);
  std::_Function_base::~_Function_base((_Function_base *)&local_d90);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"allow-insecure",&local_14c9);
  local_db0._8_8_ = 0;
  local_d98 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:163:36)>
              ::_M_invoke;
  local_da0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:163:36)>
              ::_M_manager;
  local_db0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_db0);
  std::_Function_base::~_Function_base((_Function_base *)&local_db0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"accessibility",&local_14c9);
  local_dd0._8_8_ = 0;
  local_db8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:164:38)>
              ::_M_invoke;
  local_dc0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:164:38)>
              ::_M_manager;
  local_dd0._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_dd0,true,
             initOptionTables::yn_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_dd0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"extract",&local_14c9);
  local_df0._8_8_ = 0;
  local_dd8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:165:32)>
              ::_M_invoke;
  local_de0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:165:32)>
              ::_M_manager;
  local_df0._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_df0,true,
             initOptionTables::yn_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_df0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"print",&local_14c9);
  local_e10._8_8_ = 0;
  local_df8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:166:30)>
              ::_M_invoke;
  local_e00 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:166:30)>
              ::_M_manager;
  local_e10._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_e10,true,
             initOptionTables::print128_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_e10);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"assemble",&local_14c9);
  local_e30._8_8_ = 0;
  local_e18 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:167:33)>
              ::_M_invoke;
  local_e20 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:167:33)>
              ::_M_manager;
  local_e30._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_e30,true,
             initOptionTables::yn_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_e30);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"annotate",&local_14c9);
  local_e50._8_8_ = 0;
  local_e38 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:168:33)>
              ::_M_invoke;
  local_e40 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:168:33)>
              ::_M_manager;
  local_e50._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_e50,true,
             initOptionTables::yn_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_e50);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"form",&local_14c9);
  local_e70._8_8_ = 0;
  local_e58 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:169:29)>
              ::_M_invoke;
  local_e60 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:169:29)>
              ::_M_manager;
  local_e70._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_e70,true,
             initOptionTables::yn_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_e70);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"modify-other",&local_14c9);
  local_e90._8_8_ = 0;
  local_e78 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:170:37)>
              ::_M_invoke;
  local_e80 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:170:37)>
              ::_M_manager;
  local_e90._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_e90,true,
             initOptionTables::yn_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_e90);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"modify",&local_14c9);
  local_eb0._8_8_ = 0;
  local_e98 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:171:31)>
              ::_M_invoke;
  local_ea0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:171:31)>
              ::_M_manager;
  local_eb0._M_unused._M_object = this;
  QPDFArgParser::addChoices
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_eb0,true,
             initOptionTables::modify128_choices);
  std::_Function_base::~_Function_base((_Function_base *)&local_eb0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"underlay/overlay",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_1438,&b,0x1f7724);
  QPDFArgParser::registerOptionTable(&this->ap,&local_14c8,&local_1438);
  std::_Function_base::~_Function_base(&local_1438.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_ed0,&p,0x1f775a);
  QPDFArgParser::addPositional(&this->ap,&local_ed0);
  std::_Function_base::~_Function_base(&local_ed0.super__Function_base);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"file",&local_14c9);
  local_ef0._8_8_ = 0;
  local_ed8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:174:39)>
              ::_M_invoke;
  local_ee0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:174:39)>
              ::_M_manager;
  local_ef0._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_ef0,"file");
  std::_Function_base::~_Function_base((_Function_base *)&local_ef0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"to",&local_14c9);
  local_f10._8_8_ = 0;
  local_ef8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:175:37)>
              ::_M_invoke;
  local_f00 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:175:37)>
              ::_M_manager;
  local_f10._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_f10,"page-range");
  std::_Function_base::~_Function_base((_Function_base *)&local_f10);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"from",&local_14c9);
  local_f30._8_8_ = 0;
  local_f18 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:176:39)>
              ::_M_invoke;
  local_f20 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:176:39)>
              ::_M_manager;
  local_f30._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_f30,"page-range");
  std::_Function_base::~_Function_base((_Function_base *)&local_f30);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"repeat",&local_14c9);
  local_f50._8_8_ = 0;
  local_f38 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:177:41)>
              ::_M_invoke;
  local_f40 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:177:41)>
              ::_M_manager;
  local_f50._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_f50,"page-range");
  std::_Function_base::~_Function_base((_Function_base *)&local_f50);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"password",&local_14c9);
  local_f70._8_8_ = 0;
  local_f58 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:178:43)>
              ::_M_invoke;
  local_f60 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:178:43)>
              ::_M_manager;
  local_f70._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_f70,"password");
  std::_Function_base::~_Function_base((_Function_base *)&local_f70);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"attachment",&local_14c9)
  ;
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_1458,&b,0x1f7764);
  QPDFArgParser::registerOptionTable(&this->ap,&local_14c8,&local_1458);
  std::_Function_base::~_Function_base(&local_1458.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_f90,&p,0x1f779a);
  QPDFArgParser::addPositional(&this->ap,&local_f90);
  std::_Function_base::~_Function_base(&local_f90.super__Function_base);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"replace",&local_14c9);
  local_fb0._8_8_ = 0;
  local_f98 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:181:29)>
              ::_M_invoke;
  local_fa0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:181:29)>
              ::_M_manager;
  local_fb0._M_unused._M_object = this;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_fb0);
  std::_Function_base::~_Function_base((_Function_base *)&local_fb0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"key",&local_14c9);
  local_fd0._8_8_ = 0;
  local_fb8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:182:38)>
              ::_M_invoke;
  local_fc0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:182:38)>
              ::_M_manager;
  local_fd0._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_fd0,"attachment-key");
  std::_Function_base::~_Function_base((_Function_base *)&local_fd0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"filename",&local_14c9);
  local_ff0._8_8_ = 0;
  local_fd8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:183:43)>
              ::_M_invoke;
  local_fe0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:183:43)>
              ::_M_manager;
  local_ff0._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_ff0,"filename");
  std::_Function_base::~_Function_base((_Function_base *)&local_ff0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"creationdate",&local_14c9);
  local_1010._8_8_ = 0;
  local_ff8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:184:47)>
              ::_M_invoke;
  local_1000 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:184:47)>
               ::_M_manager;
  local_1010._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_1010,"creation-date");
  std::_Function_base::~_Function_base((_Function_base *)&local_1010);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"moddate",&local_14c9);
  local_1030._8_8_ = 0;
  local_1018 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:185:42)>
               ::_M_invoke;
  local_1020 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:185:42)>
               ::_M_manager;
  local_1030._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_1030,"modification-date");
  std::_Function_base::~_Function_base((_Function_base *)&local_1030);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"mimetype",&local_14c9);
  local_1050._8_8_ = 0;
  local_1038 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:186:43)>
               ::_M_invoke;
  local_1040 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:186:43)>
               ::_M_manager;
  local_1050._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_1050,"mime/type");
  std::_Function_base::~_Function_base((_Function_base *)&local_1050);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"description",&local_14c9);
  local_1070._8_8_ = 0;
  local_1058 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:187:46)>
               ::_M_invoke;
  local_1060 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:187:46)>
               ::_M_manager;
  local_1070._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_1070,"description");
  std::_Function_base::~_Function_base((_Function_base *)&local_1070);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"copy attachment",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_1478,&b,0x1f77a4);
  QPDFArgParser::registerOptionTable(&this->ap,&local_14c8,&local_1478);
  std::_Function_base::~_Function_base(&local_1478.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_1090,&p,0x1f77da);
  QPDFArgParser::addPositional(&this->ap,&local_1090);
  std::_Function_base::~_Function_base(&local_1090.super__Function_base);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"prefix",&local_14c9);
  local_10b0._8_8_ = 0;
  local_1098 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:190:41)>
               ::_M_invoke;
  local_10a0 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:190:41)>
               ::_M_manager;
  local_10b0._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_10b0,"prefix");
  std::_Function_base::~_Function_base((_Function_base *)&local_10b0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"password",&local_14c9);
  local_10d0._8_8_ = 0;
  local_10b8 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:191:43)>
               ::_M_invoke;
  local_10c0 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_init.hh:191:43)>
               ::_M_manager;
  local_10d0._M_unused._M_object = this;
  QPDFArgParser::addRequiredParameter
            (&this->ap,&local_14c8,(param_arg_handler_t *)&local_10d0,"password");
  std::_Function_base::~_Function_base((_Function_base *)&local_10d0);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14c8,"set page labels",&local_14c9);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_1498,&b,0x1f77e4);
  QPDFArgParser::registerOptionTable(&this->ap,&local_14c8,&local_1498);
  std::_Function_base::~_Function_base(&local_1498.super__Function_base);
  std::__cxx11::string::~string((string *)&local_14c8);
  initOptionTables::anon_class_8_1_8991fb9c::operator()(&local_10f0,&p,0x1f7802);
  QPDFArgParser::addPositional(&this->ap,&local_10f0);
  std::_Function_base::~_Function_base(&local_10f0.super__Function_base);
  local_1110._8_8_ = 0;
  local_10f8 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_argv.cc:61:28)>
               ::_M_invoke;
  local_1100 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_argv.cc:61:28)>
               ::_M_manager;
  local_1110._M_unused._M_object = this;
  QPDFArgParser::addFinalCheck(&this->ap,(bare_arg_handler_t *)&local_1110);
  std::_Function_base::~_Function_base((_Function_base *)&local_1110);
  add_help(&this->ap);
  QPDFArgParser::selectMainOptionTable(&this->ap);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_14c8,"--",&local_14c9);
  local_1138._M_unused._M_object = (void *)0x0;
  local_1138._8_8_ = 0;
  local_1120 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_argv.cc:68:28)>
               ::_M_invoke;
  local_1128 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_argv.cc:68:28)>
               ::_M_manager;
  QPDFArgParser::addBare(&this->ap,&local_14c8,(bare_arg_handler_t *)&local_1138);
  std::_Function_base::~_Function_base((_Function_base *)&local_1138);
  std::__cxx11::string::~string((string *)&local_14c8);
  return;
}

Assistant:

void
ArgParser::initOptionTables()
{
#include <qpdf/auto_job_init.hh>
    this->ap.addFinalCheck([this]() { c_main->checkConfiguration(); });
    // add_help is defined in auto_job_help.hh
    add_help(this->ap);
    // Special case: ignore -- at the top level. This undocumented behavior is for backward
    // compatibility; it was unintentionally the case prior to 10.6, and some users were relying on
    // it.
    this->ap.selectMainOptionTable();
    this->ap.addBare("--", []() {});
}